

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurlURLInputStream.cpp
# Opt level: O0

size_t __thiscall
xercesc_4_0::CurlURLInputStream::readCallback
          (CurlURLInputStream *this,char *buffer,size_t size,size_t nitems)

{
  size_t local_30;
  XMLSize_t len;
  size_t nitems_local;
  size_t size_local;
  char *buffer_local;
  CurlURLInputStream *this_local;
  
  local_30 = size * nitems;
  if (this->fPayloadLen < local_30) {
    local_30 = this->fPayloadLen;
  }
  memcpy(buffer,this->fPayload,local_30);
  this->fPayload = this->fPayload + local_30;
  this->fPayloadLen = this->fPayloadLen - local_30;
  return local_30;
}

Assistant:

size_t
CurlURLInputStream::readCallback(char *buffer,
                                 size_t size,
                                 size_t nitems)
{
    XMLSize_t len = size * nitems;
    if(len > fPayloadLen) len = fPayloadLen;

    memcpy(buffer, fPayload, len);

    fPayload += len;
    fPayloadLen -= len;

    return len;
}